

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r900sixx.cpp
# Opt level: O3

void IKSolver::polyroots4(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  int iVar10;
  int iVar11;
  int j;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  bool visited [4];
  complex<double> roots [4];
  complex<double> coeffs [4];
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  IkReal *local_100;
  int *local_f8;
  ulong local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8 [6];
  undefined1 local_a8 [8];
  double adStack_a0 [14];
  
  dVar1 = *rawcoeffs;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    polyroots3(rawcoeffs + 1,rawroots,numroots);
    return;
  }
  adStack_a0[0xb] = 0.0;
  adStack_a0[0xc] = 0.0;
  adStack_a0[9] = 0.0;
  adStack_a0[10] = 0.0;
  adStack_a0[7] = 0.0;
  adStack_a0[8] = 0.0;
  adStack_a0[5] = 0.0;
  adStack_a0[6] = 0.0;
  lVar5 = 0;
  do {
    auVar14._8_4_ = SUB84(dVar1,0);
    auVar14._0_8_ = dVar1;
    auVar14._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar14 = divpd(*(undefined1 (*) [16])((long)rawcoeffs + lVar5 + 8),auVar14);
    *(long *)((long)adStack_a0 + lVar5 * 2 + 0x38) = auVar14._8_8_;
    *(undefined8 *)((long)adStack_a0 + lVar5 * 2 + 0x40) = 0;
    *(long *)((long)adStack_a0 + lVar5 * 2 + 0x28) = auVar14._0_8_;
    *(undefined8 *)((long)adStack_a0 + lVar5 * 2 + 0x30) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x20);
  adStack_a0[3] = 0.0;
  adStack_a0[4] = 0.0;
  adStack_a0[1] = 0.0;
  adStack_a0[2] = 0.0;
  local_d8[4] = 1.0;
  local_d8[5] = 0.0;
  local_a8 = (undefined1  [8])0x3fd999999999999a;
  adStack_a0[0] = 0.9;
  local_d8[0] = 1.0;
  local_d8[1] = 1.0;
  lVar5 = 0x10;
  local_100 = rawroots;
  local_f8 = numroots;
  do {
    local_128._0_8_ = *(double *)((long)local_d8 + lVar5 * 2 + 0x10);
    local_128._8_8_ = *(undefined8 *)((long)local_d8 + lVar5 * 2 + 0x18);
    std::complex<double>::operator*=((complex<double> *)local_128,(complex<double> *)local_a8);
    *(undefined8 *)(local_a8 + lVar5 * 2 + -0x10) = local_128._0_8_;
    *(undefined8 *)(local_a8 + lVar5 * 2 + -8) = local_128._8_8_;
    *(undefined8 *)((long)local_d8 + lVar5) = 0x3ff0000000000000;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x20);
  local_e8 = adStack_a0[5];
  dStack_e0 = adStack_a0[6];
  local_f0 = 0;
LAB_0012f346:
  do {
    bVar4 = true;
    lVar5 = 0;
    do {
      pdVar8 = (double *)(local_a8 + lVar5 * 0x10 + -0x10);
      lVar12 = lVar5;
      while (local_d8[lVar12] < 2.842170943040401e-14) {
        lVar12 = lVar12 + 1;
        pdVar8 = pdVar8 + 2;
        if (lVar12 == 4) {
          uVar7 = (int)local_f0 + 1;
          local_f0 = (ulong)uVar7;
          if (!bVar4 && uVar7 != 0x6e) goto LAB_0012f346;
          goto LAB_0012f486;
        }
      }
      local_118._8_4_ = SUB84(pdVar8[1] + dStack_e0,0);
      local_118._0_8_ = *pdVar8 + local_e8;
      local_118._12_4_ = (int)((ulong)(pdVar8[1] + dStack_e0) >> 0x20);
      lVar5 = 0x10;
      do {
        local_128._0_8_ = *pdVar8;
        local_128._8_8_ = pdVar8[1];
        std::complex<double>::operator*=((complex<double> *)local_128,(complex<double> *)local_118);
        dVar1 = (double)local_128._0_8_ + *(double *)((long)adStack_a0 + lVar5 + 0x28);
        dVar13 = (double)local_128._8_8_ + *(double *)((long)adStack_a0 + lVar5 + 0x30);
        local_118._8_4_ = SUB84(dVar13,0);
        local_118._0_8_ = dVar1;
        local_118._12_4_ = (int)((ulong)dVar13 >> 0x20);
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      pdVar9 = local_d8 + 5;
      lVar5 = 0;
      do {
        if (lVar12 != lVar5) {
          dVar16 = *pdVar8;
          dVar15 = pdVar8[1];
          dVar2 = pdVar9[-1];
          dVar3 = *pdVar9;
          if ((dVar16 == dVar2) && (!NAN(dVar16) && !NAN(dVar2))) {
            if ((dVar15 == dVar3) && (!NAN(dVar15) && !NAN(dVar3))) goto LAB_0012f41a;
          }
          dVar1 = (double)__divdc3(SUB84(dVar1,0),dVar13,dVar16 - dVar2,dVar15 - dVar3);
          local_118._8_8_ = dVar13;
          local_118._0_8_ = dVar1;
        }
LAB_0012f41a:
        lVar5 = lVar5 + 1;
        pdVar9 = pdVar9 + 2;
      } while (lVar5 != 4);
      *pdVar8 = *pdVar8 - dVar1;
      pdVar8[1] = pdVar8[1] - dVar13;
      dVar1 = cabs(dVar1);
      local_d8[lVar12] = dVar1;
      lVar5 = lVar12 + 1;
      bVar4 = false;
    } while (lVar12 != 3);
    uVar7 = (int)local_f0 + 1;
    local_f0 = (ulong)uVar7;
    if (uVar7 == 0x6e) {
LAB_0012f486:
      uVar6 = 0;
      *local_f8 = 0;
      local_128._0_8_ = local_128._0_8_ & 0xffffffff00000000;
      lVar5 = 1;
      pdVar8 = adStack_a0;
      iVar10 = 0;
      do {
        if (local_128[uVar6] == '\0') {
          dVar1 = *(double *)(local_a8 + uVar6 * 0x10 + -0x10);
          dVar13 = *(double *)(local_a8 + uVar6 * 0x10 + -8);
          iVar11 = 1;
          pdVar9 = pdVar8;
          lVar12 = lVar5;
          dVar16 = dVar13;
          dVar15 = dVar1;
          if (uVar6 < 3) {
            do {
              if ((ABS(dVar1 - pdVar9[-1]) < 1.4901161193847656e-08) &&
                 (ABS(dVar13 - *pdVar9) < 0.002)) {
                dVar15 = dVar15 + pdVar9[-1];
                dVar16 = dVar16 + *pdVar9;
                iVar11 = iVar11 + 1;
                local_128[lVar12] = 1;
              }
              lVar12 = lVar12 + 1;
              pdVar9 = pdVar9 + 2;
            } while (lVar12 != 4);
          }
          if (1 < iVar11) {
            dVar16 = dVar16 / (double)iVar11;
          }
          if (ABS(dVar16) < 1.4901161193847656e-08) {
            if (1 < iVar11) {
              dVar15 = dVar15 / (double)iVar11;
            }
            lVar12 = (long)iVar10;
            iVar10 = iVar10 + 1;
            *local_f8 = iVar10;
            local_100[lVar12] = dVar15;
          }
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 1;
        pdVar8 = pdVar8 + 2;
      } while (uVar6 != 4);
      return;
    }
  } while( true );
}

Assistant:

static inline void polyroots4(IkReal rawcoeffs[4+1], IkReal rawroots[4], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots3(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[4];
    const int maxsteps = 110;
    for(int i = 0; i < 4; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[4];
    IkReal err[4];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 4; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 4; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 4; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 4; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[4] = {false};
    for(int i = 0; i < 4; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 4; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}